

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

optional_idx __thiscall
duckdb::GroupedAggregateHashTable::TryAddDictionaryGroups
          (GroupedAggregateHashTable *this,DataChunk *groups,DataChunk *payload,
          unsafe_vector<idx_t> *filter)

{
  DataChunk *this_00;
  sel_t *psVar1;
  sel_t *psVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  long lVar6;
  _Alloc_hider __p;
  bool bVar7;
  reference pvVar8;
  idx_t iVar9;
  string *__rhs;
  Vector *pVVar10;
  pointer __p_00;
  idx_t index;
  TupleDataLayout *pTVar11;
  type pVVar12;
  InternalException *this_01;
  ulong uVar13;
  idx_t i_2;
  ulong uVar14;
  idx_t i_1;
  ulong uVar15;
  SelectionVector *__lhs;
  allocator local_c9;
  DataChunk *local_c8;
  SelectionVector *local_c0;
  optional_idx local_b8;
  idx_t dict_size;
  SelectionVector *local_a8;
  string local_a0;
  idx_t local_80;
  unsafe_vector<idx_t> *local_78;
  GroupedAggregateHashTable *local_70;
  DataChunk *local_68;
  shared_ptr<duckdb::TupleDataLayout,_true> *local_60;
  optional_idx opt_dict_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar8 = vector<duckdb::Vector,_true>::get<true>(&groups->data,0);
  opt_dict_size = DictionaryVector::DictionarySize(pvVar8);
  if (opt_dict_size.index == 0xffffffffffffffff) {
    return (optional_idx)0xffffffffffffffff;
  }
  local_c8 = groups;
  local_68 = payload;
  iVar9 = optional_idx::GetIndex(&opt_dict_size);
  dict_size = iVar9;
  __rhs = DictionaryVector::DictionaryId_abi_cxx11_(pvVar8);
  if (__rhs->_M_string_length == 0) {
    if (local_c8->count <= iVar9 * 2) {
      return (optional_idx)0xffffffffffffffff;
    }
  }
  else if (19999 < iVar9) {
    return (optional_idx)0xffffffffffffffff;
  }
  pVVar10 = DictionaryVector::Child(pvVar8);
  local_a8 = DictionaryVector::SelVector(pvVar8);
  __lhs = (SelectionVector *)&(this->state).dict_state;
  if (((this->state).dict_state.dictionary_id._M_string_length == 0) ||
     (bVar7 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,__rhs), bVar7)) {
    if ((this->state).dict_state.capacity < iVar9) {
      make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&,unsigned_long&>
                ((duckdb *)&local_a0,&LogicalType::POINTER,&dict_size);
      __p._M_p = local_a0._M_dataplus._M_p;
      local_a0._M_dataplus._M_p = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
                ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
                 &(this->state).dict_state.dictionary_addresses,(pointer)__p._M_p);
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_a0);
      iVar9 = dict_size;
      __p_00 = (pointer)operator_new__(dict_size);
      local_c0 = __lhs;
      switchD_016d4fed::default(__p_00,0,iVar9);
      __lhs = local_c0;
      local_a0._M_dataplus._M_p = (pointer)0x0;
      ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
                ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)
                 &(this->state).dict_state.found_entry,__p_00);
      ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
                ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&local_a0);
      (this->state).dict_state.capacity = dict_size;
      iVar9 = dict_size;
    }
    switchD_016d4fed::default
              ((this->state).dict_state.found_entry.
               super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
               super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,iVar9);
    ::std::__cxx11::string::_M_assign((string *)__lhs);
  }
  else if ((this->state).dict_state.capacity < iVar9) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_a0,
               "AggregateHT - using cached dictionary data but dictionary has changed (dictionary id %s - dict size %d, current capacity %d)"
               ,&local_c9);
    ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
    InternalException::InternalException<std::__cxx11::string,unsigned_long,unsigned_long>
              (this_01,&local_a0,&local_50,iVar9,(this->state).dict_state.capacity);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_c0 = &(this->state).dict_state.unique_entries;
  uVar15 = local_c8->count;
  psVar1 = local_a8->sel_vector;
  psVar2 = (this->state).dict_state.unique_entries.sel_vector;
  _Var3._M_head_impl =
       (this->state).dict_state.found_entry.super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
       _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  iVar9 = 0;
  for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    uVar14 = uVar13;
    if (psVar1 != (sel_t *)0x0) {
      uVar14 = (ulong)psVar1[uVar13];
    }
    psVar2[iVar9] = (sel_t)uVar14;
    iVar9 = iVar9 + ((ulong)_Var3._M_head_impl[uVar14] ^ 1);
    _Var3._M_head_impl[uVar14] = true;
  }
  if (iVar9 == 0) {
    index = 0;
  }
  else {
    this_00 = &(this->state).dict_state.unique_values;
    if (*(pointer *)
         ((long)&(this->state).dict_state.unique_values.data.
                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl + 8) ==
        (this->state).dict_state.unique_values.data.
        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_a0,local_c8);
      DataChunk::InitializeEmpty(this_00,(vector<duckdb::LogicalType,_true> *)&local_a0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a0);
    }
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,0);
    Vector::Slice(pvVar8,pVVar10,local_c0,iVar9);
    (this->state).dict_state.unique_values.count = iVar9;
    pVVar10 = &(this->state).dict_state.hashes;
    DataChunk::Hash(this_00,pVVar10);
    index = FindOrCreateGroupsInternal
                      (this,this_00,pVVar10,&(this->state).dict_state.new_dictionary_pointers,
                       &(this->state).new_groups);
  }
  local_60 = &(this->super_BaseAggregateHashTable).layout_ptr;
  pTVar11 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(local_60);
  if ((pTVar11->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pTVar11->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pdVar4 = (this->state).dict_state.new_dictionary_pointers.data;
    local_80 = index;
    local_78 = filter;
    local_70 = this;
    pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (&(this->state).dict_state.dictionary_addresses);
    pdVar5 = pVVar12->data;
    for (uVar15 = 0; iVar9 != uVar15; uVar15 = uVar15 + 1) {
      uVar13 = uVar15;
      if (local_c0->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)local_c0->sel_vector[uVar15];
      }
      lVar6 = *(long *)(pdVar4 + uVar15 * 8);
      pTVar11 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(local_60);
      *(idx_t *)(pdVar5 + uVar13 * 8) = lVar6 + pTVar11->flag_width + pTVar11->data_width;
    }
    pdVar4 = (local_70->state).addresses.data;
    psVar1 = local_a8->sel_vector;
    for (uVar15 = 0; uVar15 < local_c8->count; uVar15 = uVar15 + 1) {
      uVar13 = uVar15;
      if (psVar1 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar1[uVar15];
      }
      *(undefined8 *)(pdVar4 + uVar15 * 8) = *(undefined8 *)(pdVar5 + uVar13 * 8);
    }
    UpdateAggregates(local_70,local_68,local_78);
    index = local_80;
  }
  optional_idx::optional_idx(&local_b8,index);
  return (optional_idx)local_b8.index;
}

Assistant:

optional_idx GroupedAggregateHashTable::TryAddDictionaryGroups(DataChunk &groups, DataChunk &payload,
                                                               const unsafe_vector<idx_t> &filter) {
	static constexpr idx_t MAX_DICTIONARY_SIZE_THRESHOLD = 20000;
	static constexpr idx_t DICTIONARY_THRESHOLD = 2;
	// dictionary vector - check if this is a duplicate eliminated dictionary from the storage
	auto &dict_col = groups.data[0];
	auto opt_dict_size = DictionaryVector::DictionarySize(dict_col);
	if (!opt_dict_size.IsValid()) {
		// dict size not known - this is not a dictionary that comes from the storage
		return optional_idx();
	}
	idx_t dict_size = opt_dict_size.GetIndex();
	auto &dictionary_id = DictionaryVector::DictionaryId(dict_col);
	if (dictionary_id.empty()) {
		// dictionary has no id, we can't cache across vectors
		// only use dictionary compression if there are fewer entries than groups
		if (dict_size * DICTIONARY_THRESHOLD >= groups.size()) {
			// dictionary is too large - use regular aggregation
			return optional_idx();
		}
	} else {
		// dictionary has an id - we can cache across vectors
		// use a much larger limit for dictionary
		if (dict_size >= MAX_DICTIONARY_SIZE_THRESHOLD) {
			// dictionary is too large - use regular aggregation
			return optional_idx();
		}
	}
	auto &dictionary_vector = DictionaryVector::Child(dict_col);
	auto &offsets = DictionaryVector::SelVector(dict_col);
	auto &dict_state = state.dict_state;
	if (dict_state.dictionary_id.empty() || dict_state.dictionary_id != dictionary_id) {
		// new dictionary - initialize the index state
		if (dict_size > dict_state.capacity) {
			dict_state.dictionary_addresses = make_uniq<Vector>(LogicalType::POINTER, dict_size);
			dict_state.found_entry = make_unsafe_uniq_array<bool>(dict_size);
			dict_state.capacity = dict_size;
		}
		memset(dict_state.found_entry.get(), 0, dict_size * sizeof(bool));
		dict_state.dictionary_id = dictionary_id;
	} else if (dict_size > dict_state.capacity) {
		throw InternalException("AggregateHT - using cached dictionary data but dictionary has changed (dictionary id "
		                        "%s - dict size %d, current capacity %d)",
		                        dict_state.dictionary_id, dict_size, dict_state.capacity);
	}

	auto &found_entry = dict_state.found_entry;
	auto &unique_entries = dict_state.unique_entries;
	idx_t unique_count = 0;
	// for each of the dictionary entries - check if we have already done a look-up into the hash table
	// if we have, we can just use the cached group pointers
	for (idx_t i = 0; i < groups.size(); i++) {
		auto dict_idx = offsets.get_index(i);
		unique_entries.set_index(unique_count, dict_idx);
		unique_count += !found_entry[dict_idx];
		found_entry[dict_idx] = true;
	}
	auto &new_dictionary_pointers = dict_state.new_dictionary_pointers;
	idx_t new_group_count = 0;
	if (unique_count > 0) {
		auto &unique_values = dict_state.unique_values;
		if (unique_values.ColumnCount() == 0) {
			unique_values.InitializeEmpty(groups.GetTypes());
		}
		// slice the dictionary
		unique_values.data[0].Slice(dictionary_vector, unique_entries, unique_count);
		unique_values.SetCardinality(unique_count);
		// now we know which entries we are going to add - hash them
		auto &hashes = dict_state.hashes;
		unique_values.Hash(hashes);

		// add the dictionary groups to the hash table
		new_group_count = FindOrCreateGroups(unique_values, hashes, new_dictionary_pointers, state.new_groups);
	}
	auto &aggregates = layout_ptr->GetAggregates();
	if (aggregates.empty()) {
		// early-out - no aggregates to update
		return new_group_count;
	}

	// set the addresses that we found for each of the unique groups in the main addresses vector
	auto new_dict_addresses = FlatVector::GetData<uintptr_t>(new_dictionary_pointers);
	// for each of the new groups, add them to the global (cached) list of addresses for the dictionary
	auto &dictionary_addresses = *dict_state.dictionary_addresses;
	auto dict_addresses = FlatVector::GetData<uintptr_t>(dictionary_addresses);
	for (idx_t i = 0; i < unique_count; i++) {
		auto dict_idx = unique_entries.get_index(i);
		dict_addresses[dict_idx] = new_dict_addresses[i] + layout_ptr->GetAggrOffset();
	}
	// now set up the addresses for the aggregates
	auto result_addresses = FlatVector::GetData<uintptr_t>(state.addresses);
	for (idx_t i = 0; i < groups.size(); i++) {
		auto dict_idx = offsets.get_index(i);
		result_addresses[i] = dict_addresses[dict_idx];
	}

	// finally process the aggregates
	UpdateAggregates(payload, filter);

	return new_group_count;
}